

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O1

int nn_timerset_add(nn_timerset *self,int timeout,nn_timerset_hndl *hndl)

{
  uint64_t uVar1;
  nn_list_item *it;
  nn_list_item *pnVar2;
  
  uVar1 = nn_clock_ms();
  hndl->timeout = (long)timeout + uVar1;
  it = nn_list_begin(&self->timeouts);
  while( true ) {
    pnVar2 = nn_list_end(&self->timeouts);
    if ((it == pnVar2) || ((nn_list_item *)hndl->timeout < it[1].next)) break;
    it = nn_list_next(&self->timeouts,it);
  }
  pnVar2 = nn_list_begin(&self->timeouts);
  nn_list_insert(&self->timeouts,&hndl->list,it);
  return (uint)(pnVar2 == it);
}

Assistant:

int nn_timerset_add (struct nn_timerset *self, int timeout,
    struct nn_timerset_hndl *hndl)
{
    struct nn_list_item *it;
    struct nn_timerset_hndl *ith;
    int first;

    /*  Compute the instant when the timeout will be due. */
    hndl->timeout = nn_clock_ms()  + timeout;

    /*  Insert it into the ordered list of timeouts. */
    for (it = nn_list_begin (&self->timeouts);
          it != nn_list_end (&self->timeouts);
          it = nn_list_next (&self->timeouts, it)) {
        ith = nn_cont (it, struct nn_timerset_hndl, list);
        if (hndl->timeout < ith->timeout)
            break;
    }

    /*  If the new timeout happens to be the first one to expire, let the user
        know that the current waiting interval has to be changed. */
    first = nn_list_begin (&self->timeouts) == it ? 1 : 0;
    nn_list_insert (&self->timeouts, &hndl->list, it);
    return first;
}